

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

void __thiscall
icu_63::RBBIStateDescriptor::RBBIStateDescriptor
          (RBBIStateDescriptor *this,int lastInputSymbol,UErrorCode *fStatus)

{
  UVector32 *this_00;
  undefined4 in_register_00000034;
  UVector32 *this_01;
  
  this->fMarked = '\0';
  this->fAccepting = 0;
  this->fLookAhead = 0;
  this->fTagsIdx = 0;
  this->fTagVals = (UVector *)0x0;
  this->fPositions = (UVector *)0x0;
  this->fDtran = (UVector32 *)0x0;
  this_00 = (UVector32 *)
            UMemory::operator_new((UMemory *)0x20,CONCAT44(in_register_00000034,lastInputSymbol));
  this_01 = (UVector32 *)0x0;
  if (this_00 != (UVector32 *)0x0) {
    UVector32::UVector32(this_00,lastInputSymbol + 1,fStatus);
    this_01 = this_00;
  }
  this->fDtran = this_01;
  if (*fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this_01 != (UVector32 *)0x0) {
      UVector32::setSize(this_01,lastInputSymbol + 1);
      return;
    }
    *fStatus = U_MEMORY_ALLOCATION_ERROR;
  }
  return;
}

Assistant:

RBBIStateDescriptor::RBBIStateDescriptor(int lastInputSymbol, UErrorCode *fStatus) {
    fMarked    = FALSE;
    fAccepting = 0;
    fLookAhead = 0;
    fTagsIdx   = 0;
    fTagVals   = NULL;
    fPositions = NULL;
    fDtran     = NULL;

    fDtran     = new UVector32(lastInputSymbol+1, *fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }
    if (fDtran == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    fDtran->setSize(lastInputSymbol+1);    // fDtran needs to be pre-sized.
                                           //   It is indexed by input symbols, and will
                                           //   hold  the next state number for each
                                           //   symbol.
}